

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::setOperation(QHttpNetworkRequest *this,Operation operation)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->operation = operation;
  return;
}

Assistant:

void QHttpNetworkRequest::setOperation(Operation operation)
{
    d->operation = operation;
}